

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckClasses.cpp
# Opt level: O0

void __thiscall
GdlGlyphDefn::CheckExistenceOfGlyphAttr
          (GdlGlyphDefn *this,GdlObject *pgdlAvsOrExp,GrcSymbolTable *param_3,
          GrcGlyphAttrMatrix *pgax,Symbol psymGlyphAttr)

{
  ulong uVar1;
  byte bVar2;
  bool bVar3;
  size_type_conflict sVar4;
  reference pvVar5;
  undefined8 in_RSI;
  string *in_RDI;
  GrcSymbolTableEntry *in_R8;
  gid16 in_stack_0000008e;
  gid16 wGlyphID;
  size_t iw;
  bool fGpoint;
  int nGlyphAttrID;
  string *in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeb0;
  undefined2 in_stack_fffffffffffffeb4;
  gid16 in_stack_fffffffffffffeb6;
  GrcGlyphAttrMatrix *in_stack_fffffffffffffeb8;
  undefined8 in_stack_fffffffffffffec0;
  GrcGlyphAttrMatrix *in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed8;
  GrcSymbolTableEntry *staMsg;
  allocator *pgdlobj;
  undefined4 in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  GrcErrorList *in_stack_ffffffffffffff00;
  string *in_stack_ffffffffffffff10;
  undefined1 local_e1 [33];
  string local_c0 [39];
  undefined1 local_99 [39];
  value_type local_72;
  ulong local_70;
  allocator local_51;
  string local_50 [35];
  byte local_2d;
  int local_2c;
  GrcSymbolTableEntry *local_28;
  undefined8 local_10;
  
  local_28 = in_R8;
  local_10 = in_RSI;
  local_2c = GrcSymbolTableEntry::InternalID(in_R8);
  pgdlobj = &local_51;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"gpoint",pgdlobj);
  bVar2 = GrcSymbolTableEntry::LastFieldIs
                    ((GrcSymbolTableEntry *)
                     CONCAT26(in_stack_fffffffffffffeb6,
                              CONCAT24(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0)),
                     in_stack_fffffffffffffea8);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  local_2d = bVar2 & 1;
  staMsg = local_28;
  for (local_70 = 0; uVar1 = local_70,
      sVar4 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                        ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(in_RDI + 0x70))
      , uVar1 < sVar4; local_70 = local_70 + 1) {
    pvVar5 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                       ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(in_RDI + 0x70),
                        local_70);
    if (*pvVar5 != 0xfffb) {
      pvVar5 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                         ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(in_RDI + 0x70)
                          ,local_70);
      local_72 = *pvVar5;
      if ((((local_2d & 1) != 0) &&
          (bVar3 = GrcGlyphAttrMatrix::GpointDefined
                             (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb6,
                              in_stack_fffffffffffffeb0,
                              (int)((ulong)in_stack_fffffffffffffea8 >> 0x20)), !bVar3)) ||
         (((local_2d & 1) == 0 &&
          (bVar3 = GrcGlyphAttrMatrix::Defined
                             (in_stack_fffffffffffffec8,
                              (gid16)((ulong)in_stack_fffffffffffffec0 >> 0x30),
                              (int)in_stack_fffffffffffffec0,
                              (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20)), !bVar3)))) {
        in_stack_fffffffffffffec8 = (GrcGlyphAttrMatrix *)local_99;
        in_stack_fffffffffffffec0 = local_10;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)(local_99 + 1),"Glyph attribute \'",
                   (allocator *)in_stack_fffffffffffffec8);
        GrcSymbolTableEntry::FullName_abi_cxx11_
                  ((GrcSymbolTableEntry *)
                   CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        in_stack_fffffffffffffeb8 = (GrcGlyphAttrMatrix *)local_e1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)(local_e1 + 1),"\' is not defined for glyph ",
                   (allocator *)in_stack_fffffffffffffeb8);
        GlyphIDString_abi_cxx11_(in_stack_0000008e);
        in_stack_fffffffffffffea8 = (string *)&stack0xfffffffffffffef8;
        GrcErrorList::AddError
                  (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,(GdlObject *)pgdlobj,
                   &staMsg->m_staFieldName,in_RDI,
                   (string *)CONCAT17(bVar2,in_stack_fffffffffffffed8),in_stack_ffffffffffffff10);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffef8);
        std::__cxx11::string::~string((string *)(local_e1 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_e1);
        std::__cxx11::string::~string(local_c0);
        std::__cxx11::string::~string((string *)(local_99 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_99);
      }
    }
  }
  return;
}

Assistant:

void GdlGlyphDefn::CheckExistenceOfGlyphAttr(GdlObject * pgdlAvsOrExp,
	GrcSymbolTable * /*psymtbl*/, GrcGlyphAttrMatrix * pgax, Symbol psymGlyphAttr)
{
	int nGlyphAttrID = psymGlyphAttr->InternalID();
	bool fGpoint = psymGlyphAttr->LastFieldIs("gpoint");

	for (size_t iw = 0; iw < m_vwGlyphIDs.size(); iw++)
	{
		if (m_vwGlyphIDs[iw] == kBadGlyph)
			continue;

		gid16 wGlyphID = m_vwGlyphIDs[iw];
		if ((fGpoint && !pgax->GpointDefined(wGlyphID, nGlyphAttrID)) ||
			(!fGpoint && !pgax->Defined(wGlyphID, nGlyphAttrID)))
		{
			g_errorList.AddError(4138, pgdlAvsOrExp,
				"Glyph attribute '",
				psymGlyphAttr->FullName(),
				"' is not defined for glyph ",
				GlyphIDString(wGlyphID));
		}
	}
}